

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void deqp::gls::ShaderExecUtil::checkLimit(RenderContext *renderCtx,deUint32 pname,int required)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000014;
  Enum<int,_2UL> *value;
  undefined4 in_register_00000034;
  undefined1 auVar2 [16];
  int implementationLimit;
  int required_local;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  code *local_28;
  deUint32 local_20;
  
  required_local = 2;
  iVar1 = (*renderCtx->_vptr_RenderContext[3])
                    (renderCtx,CONCAT44(in_register_00000034,pname),
                     CONCAT44(in_register_00000014,required));
  implementationLimit = -1;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(pname);
  local_88._M_string_length._0_4_ = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if ((int)local_88._M_string_length != 0) {
    auVar2 = __cxa_allocate_exception(0x38);
    local_68._M_dataplus._M_p = (pointer)glu::getGettableStateName;
    local_68._M_string_length._0_4_ = pname;
    de::toString<tcu::Format::Enum<int,2ul>>(&local_108,(de *)&local_68,auVar2._8_8_);
    std::operator+(&local_e8,"Failed to query ",&local_108);
    std::operator+(&local_c8,&local_e8," - got ");
    local_88._M_dataplus._M_p = (pointer)glu::getErrorName;
    de::toString<tcu::Format::Enum<int,2ul>>(&local_128,(de *)&local_88,value);
    std::operator+(&local_a8,&local_c8,&local_128);
    tcu::TestError::TestError(auVar2._0_8_,&local_a8);
    __cxa_throw(auVar2._0_8_,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (1 < implementationLimit) {
    return;
  }
  auVar2 = __cxa_allocate_exception(0x38);
  local_28 = glu::getGettableStateName;
  local_20 = pname;
  de::toString<tcu::Format::Enum<int,2ul>>(&local_68,(de *)&local_28,auVar2._8_8_);
  std::operator+(&local_128,"Test requires ",&local_68);
  std::operator+(&local_108,&local_128," >= ");
  de::toString<int>(&local_88,&required_local);
  std::operator+(&local_e8,&local_108,&local_88);
  std::operator+(&local_c8,&local_e8,", got ");
  de::toString<int>(&local_48,&implementationLimit);
  std::operator+(&local_a8,&local_c8,&local_48);
  tcu::NotSupportedError::NotSupportedError(auVar2._0_8_,&local_a8);
  __cxa_throw(auVar2._0_8_,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void checkLimit (const glu::RenderContext& renderCtx, deUint32 pname, int required)
{
	const glw::Functions&	gl					= renderCtx.getFunctions();
	int						implementationLimit	= -1;
	deUint32				error;

	gl.getIntegerv(pname, &implementationLimit);
	error = gl.getError();

	if (error != GL_NO_ERROR)
		throw tcu::TestError("Failed to query " + de::toString(glu::getGettableStateStr(pname)) + " - got " + de::toString(glu::getErrorStr(error)));
	if (implementationLimit < required)
		throw tcu::NotSupportedError("Test requires " + de::toString(glu::getGettableStateStr(pname)) + " >= " + de::toString(required) + ", got " + de::toString(implementationLimit));
}